

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O3

bool ConvertToInt(char *str,int defaultrad,size_t len,int *Result)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  
  if (len == 0) {
    len = strlen(str);
  }
  cVar1 = *str;
  if (cVar1 == '$') {
    str = str + 1;
LAB_0013afb9:
    len = len - 1;
LAB_0013afbc:
    uVar7 = 0xe;
  }
  else {
    if (cVar1 == '0') {
      cVar1 = str[1];
      if (cVar1 != 'x') {
        if (cVar1 == 'o') {
          str = str + 2;
          len = len - 2;
          goto LAB_0013aff8;
        }
        if (cVar1 != 'X') goto LAB_0013afce;
      }
      str = str + 2;
      len = len - 2;
      goto LAB_0013afbc;
    }
    if (9 < (byte)(cVar1 - 0x30U)) {
      return false;
    }
LAB_0013afce:
    cVar1 = str[len - 1];
    if (cVar1 == 'o') {
      len = len - 1;
LAB_0013aff8:
      uVar7 = 6;
    }
    else {
      if (cVar1 == 'h') goto LAB_0013afb9;
      if (cVar1 == 'b') {
        len = len - 1;
        uVar7 = 0;
      }
      else {
        uVar7 = defaultrad - 2;
      }
    }
  }
  bVar5 = false;
  switch(uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) {
  case 0:
    if (len == 0) {
LAB_0013b13b:
      iVar3 = 0;
    }
    else {
      sVar4 = 0;
      iVar3 = 0;
      do {
        if ((str[sVar4] & 0xfeU) != 0x30) {
          return false;
        }
        iVar3 = (uint)(str[sVar4] == 0x31) + iVar3 * 2;
        sVar4 = sVar4 + 1;
      } while (len != sVar4);
    }
    break;
  default:
    goto switchD_0013b021_caseD_1;
  case 3:
    if (len == 0) goto LAB_0013b13b;
    sVar4 = 0;
    iVar3 = 0;
    do {
      if ((byte)(str[sVar4] - 0x38U) < 0xf8) {
        return false;
      }
      iVar3 = (uint)(byte)(str[sVar4] - 0x30) + iVar3 * 8;
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
    break;
  case 4:
    if (len == 0) goto LAB_0013b13b;
    sVar4 = 0;
    iVar3 = 0;
    do {
      if ((byte)(str[sVar4] - 0x3aU) < 0xf6) {
        return false;
      }
      iVar3 = (uint)(byte)(str[sVar4] - 0x30) + iVar3 * 10;
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
    break;
  case 7:
    if (len == 0) goto LAB_0013b13b;
    sVar4 = 0;
    iVar3 = 0;
    do {
      bVar2 = str[sVar4];
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
        if (0x25 < bVar2 - 0x41) {
          return false;
        }
        if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
          return false;
        }
      }
      bVar6 = bVar2 - 0x30;
      if ((0x36 < bVar6) || ((0x7e0000007e03ffU >> ((ulong)bVar6 & 0x3f) & 1) == 0)) {
        printf("Error: %c is no hex character\n");
        return false;
      }
      iVar3 = iVar3 * 0x10 + (uint)bVar2 + *(int *)(&DAT_0015a35c + (ulong)bVar6 * 4);
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  *Result = iVar3;
  bVar5 = true;
switchD_0013b021_caseD_1:
  return bVar5;
}

Assistant:

bool ConvertToInt(char* str, int defaultrad, size_t len, int& Result)
{
	int val = 0;
	int r = 0;
	if (len == 0) len = strlen(str);

	if (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))
	{
		r = 16;
		str+=2;
		len-=2;
	} else if (str[0] == '$')
	{
		r = 16;
		str++;
		len--;
	} else if (str[0] == '0' && str[1] == 'o')
	{
		r = 8;
		str+=2;
		len-=2;
	} else {
		if (!(str[0] >= '0' && str[0] <= '9')) return false;

		if (str[len-1] == 'b')
		{
			r = 2;
			len--;
		} else if (str[len-1] == 'o')
		{
			r = 8;
			len--;
		} else if (str[len-1] == 'h')
		{
			r = 16;
			len--;
		} else {
			r = defaultrad;
		}
	}

	switch (r)
	{
	case 2: // bin
		while (len--)
		{
			if (*str != '0' && *str != '1') return false;
			val = val << 1;
			if (*str++ == '1')
			{
				val++;
			}
		}
		break;
	case 8: // oct
		while (len--)
		{
			if (*str < '0' || *str > '7') return false;
			val = val << 3;
			val+=(*str++-'0');
		}
		break;
	case 10: // dec
		while (len--)
		{
			if (*str < '0' || *str > '9') return false;
			val = val * 10;
			val += (*str++ - '0');
		}
		break;
	case 16: // hex
		while (len--)
		{
			if ((*str < '0' || *str > '9') && (*str < 'A' || *str > 'F') && (*str < 'a' || *str > 'f')) return false;
			int l = htd(*str++);
			if (l >= 0)
			{
				val = val << 4;
				val += l;
			} else {
				return false;
			}
		}
		break;
	default:
		return false;
	}
	Result = val;
	return true;
}